

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestEmptyMapEntriesStringValuePopulatedInGenCode_Test::
~NoFieldPresenceTest_TestEmptyMapEntriesStringValuePopulatedInGenCode_Test
          (NoFieldPresenceTest_TestEmptyMapEntriesStringValuePopulatedInGenCode_Test *this)

{
  NoFieldPresenceTest_TestEmptyMapEntriesStringValuePopulatedInGenCode_Test *this_local;
  
  ~NoFieldPresenceTest_TestEmptyMapEntriesStringValuePopulatedInGenCode_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestEmptyMapEntriesStringValuePopulatedInGenCode) {
  // Set zero values for zero keys and test that.
  TestAllMapTypes message;
  (*message.mutable_map_int32_bytes())[0];

  // Zero keys are valid entries in gencode.
  EXPECT_EQ(1, message.map_int32_bytes().size());
  EXPECT_TRUE(message.map_int32_bytes().contains(0));
  EXPECT_EQ(1, message.map_int32_bytes().count(0));
  EXPECT_EQ("", message.map_int32_bytes().at(0));

  // Note that `has_foo` APIs are not available for implicit presence fields.
  // So there is no way to check has_field behaviour in gencode.
}